

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O3

archive * archive_write_disk_new(void)

{
  __mode_t __mask;
  __uid_t _Var1;
  archive *__ptr;
  char *pcVar2;
  archive_string *paVar3;
  
  __ptr = (archive *)calloc(1,0x2e8);
  if (__ptr != (archive *)0x0) {
    __ptr->magic = 0xc001b0c5;
    __ptr->state = 2;
    if (archive_write_disk_vtable_inited == '\0') {
      archive_write_disk_vtable_av._0_8_ = _archive_write_disk_close;
      archive_write_disk_vtable_av._80_8_ = _archive_write_disk_filter_bytes;
      archive_write_disk_vtable_av._8_8_ = _archive_write_disk_free;
      archive_write_disk_vtable_av._16_8_ = _archive_write_disk_header;
      archive_write_disk_vtable_av._24_8_ = _archive_write_disk_finish_entry;
      archive_write_disk_vtable_av._32_8_ = _archive_write_disk_data;
      archive_write_disk_vtable_av._40_8_ = _archive_write_disk_data_block;
      archive_write_disk_vtable_inited = '\x01';
    }
    __ptr->vtable = (archive_vtable_conflict *)archive_write_disk_vtable_av;
    pcVar2 = (char *)time((time_t *)0x0);
    __ptr[1].error = pcVar2;
    __mask = umask(0);
    __ptr[1].magic = __mask;
    umask(__mask);
    _Var1 = geteuid();
    __ptr[1].archive_format_name = (char *)(ulong)_Var1;
    paVar3 = archive_string_ensure((archive_string *)(__ptr + 2),0x200);
    if (paVar3 != (archive_string *)0x0) {
      *(undefined4 *)((long)&__ptr[6].error_string.s + 4) = 5;
      return __ptr;
    }
    free(__ptr);
  }
  return (archive *)0x0;
}

Assistant:

struct archive *
archive_write_disk_new(void)
{
	struct archive_write_disk *a;

	a = (struct archive_write_disk *)malloc(sizeof(*a));
	if (a == NULL)
		return (NULL);
	memset(a, 0, sizeof(*a));
	a->archive.magic = ARCHIVE_WRITE_DISK_MAGIC;
	/* We're ready to write a header immediately. */
	a->archive.state = ARCHIVE_STATE_HEADER;
	a->archive.vtable = archive_write_disk_vtable();
	a->start_time = time(NULL);
	/* Query and restore the umask. */
	umask(a->user_umask = umask(0));
#ifdef HAVE_GETEUID
	a->user_uid = geteuid();
#endif /* HAVE_GETEUID */
	if (archive_string_ensure(&a->path_safe, 512) == NULL) {
		free(a);
		return (NULL);
	}
#ifdef HAVE_ZLIB_H
	a->decmpfs_compression_level = 5;
#endif
	return (&a->archive);
}